

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_pipeline.hpp
# Opt level: O1

void __thiscall
tf::
DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:1552:59)>_>
::_on_pipe(DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
           *this,Pipeflow *pf,Runtime *param_2)

{
  int iVar1;
  TestCaseData *__nptr;
  size_t *psVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  size_t sVar4;
  code *pcVar5;
  uint __val;
  Pipeflow *pPVar6;
  char extraout_AL;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  bool bVar7;
  char extraout_AL_03;
  char extraout_AL_04;
  char extraout_AL_05;
  char extraout_AL_06;
  char extraout_AL_07;
  char extraout_AL_08;
  char extraout_AL_09;
  variant_alternative_t<1UL,_variant<int,_basic_string<char>,_monostate>_> *pvVar8;
  int *piVar9;
  long lVar10;
  uint *puVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint __len;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double dVar15;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double extraout_XMM0_Qa_11;
  double extraout_XMM0_Qa_12;
  double extraout_XMM0_Qa_13;
  double extraout_XMM0_Qa_14;
  double extraout_XMM0_Qa_15;
  double extraout_XMM0_Qa_16;
  double extraout_XMM0_Qa_17;
  double extraout_XMM0_Qa_18;
  double extraout_XMM0_Qa_19;
  double extraout_XMM0_Qa_20;
  ResultBuilder DOCTEST_RB;
  Result local_f8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [24];
  undefined2 local_b0;
  anon_union_24_2_13149d16_for_String_2 local_a8;
  anon_union_24_2_13149d16_for_String_2 aStack_90;
  bool local_78;
  char *local_70;
  char *local_68;
  uint local_5c;
  size_t local_58;
  int local_4c;
  Expression_lhs<const_unsigned_long_&> local_48;
  Pipeflow *local_38;
  
  switch(pf->_pipe) {
  case 0:
    psVar2 = (this->_pipes).
             super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
             .
             super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_false>
             ._M_head_impl._callable.j1_1;
    if (*psVar2 ==
        (this->_pipes).
        super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
        .
        super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_false>
        ._M_head_impl._callable.N) {
      if (pf->_pipe != 0) {
        throw_re<char_const(&)[39]>
                  ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp"
                   ,0x95,(char (*) [39])"only the first pipe can stop the token");
      }
      pf->_stop = true;
      local_d8._0_4_ = 0;
    }
    else {
      local_a8.buf[0] = '\0';
      local_a8.buf[0x17] = '\x17';
      aStack_90.buf[0] = '\0';
      aStack_90.buf[0x17] = '\x17';
      local_d8._0_8_ = *(undefined8 *)(doctest::detail::g_cs + 0x20);
      local_d8._8_4_ = DT_REQUIRE;
      local_c8._0_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
      ;
      local_c8._8_4_ = 0x5f7;
      local_c8._16_8_ = "j1_1 == source[j1_1]";
      local_b0._0_1_ = true;
      local_b0._1_1_ = false;
      local_78 = false;
      local_70 = "";
      local_68 = "";
      local_48.m_at = DT_REQUIRE;
      local_48.lhs = psVar2;
      doctest::detail::Expression_lhs<const_unsigned_long_&>::operator==<int,_nullptr>
                (&local_f8,&local_48,
                 (((this->_pipes).
                   super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                   .
                   super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_false>
                   ._M_head_impl._callable.source)->super__Vector_base<int,_std::allocator<int>_>).
                 _M_impl.super__Vector_impl_data._M_start + *psVar2);
      doctest::String::operator=((String *)&aStack_90.data,&local_f8.m_decomp);
      local_b0 = CONCAT11(local_b0._1_1_,local_f8.m_passed) ^ 1;
      dVar15 = extraout_XMM0_Qa_17;
      if ((local_f8.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_f8.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_f8.m_decomp.field_0.data.ptr);
        dVar15 = extraout_XMM0_Qa_18;
      }
      doctest::detail::ResultBuilder::log((ResultBuilder *)local_d8,dVar15);
      if (extraout_AL_08 != '\0') {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
      if ((local_b0._0_1_ == true) &&
         (bVar7 = doctest::detail::checkIfShouldThrow(local_d8._8_4_), bVar7)) {
        doctest::detail::throwException();
      }
      if ((aStack_90.buf[0x17] < '\0') &&
         ((void *)CONCAT71(aStack_90._1_7_,aStack_90.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(aStack_90._1_7_,aStack_90.buf[0]));
      }
      if ((local_a8.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_a8._1_7_,local_a8.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_a8._1_7_,local_a8.buf[0]));
      }
      local_a8.buf[0] = '\0';
      local_a8.buf[0x17] = '\x17';
      aStack_90.buf[0] = '\0';
      aStack_90.buf[0x17] = '\x17';
      local_d8._0_8_ = *(undefined8 *)(doctest::detail::g_cs + 0x20);
      local_d8._8_4_ = DT_REQUIRE;
      local_c8._0_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
      ;
      local_c8._8_4_ = 0x5f8;
      local_c8._16_8_ = "pf.token() % L == pf.line()";
      local_b0._0_1_ = true;
      local_b0._1_1_ = false;
      local_78 = false;
      local_70 = "";
      local_68 = "";
      local_48.lhs = (unsigned_long *)
                     (pf->_token %
                     (this->_pipes).
                     super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                     .
                     super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_false>
                     ._M_head_impl._callable.L);
      local_48.m_at = DT_REQUIRE;
      local_58 = pf->_line;
      doctest::detail::Expression_lhs<unsigned_long_const>::operator==
                (&local_f8,(Expression_lhs<unsigned_long_const> *)&local_48,&local_58);
      doctest::String::operator=((String *)&aStack_90.data,&local_f8.m_decomp);
      local_b0 = CONCAT11(local_b0._1_1_,local_f8.m_passed) ^ 1;
      dVar15 = extraout_XMM0_Qa_19;
      if ((local_f8.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_f8.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_f8.m_decomp.field_0.data.ptr);
        dVar15 = extraout_XMM0_Qa_20;
      }
      doctest::detail::ResultBuilder::log((ResultBuilder *)local_d8,dVar15);
      if (extraout_AL_09 != '\0') {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
      if ((local_b0._0_1_ == true) &&
         (bVar7 = doctest::detail::checkIfShouldThrow(local_d8._8_4_), bVar7)) {
        doctest::detail::throwException();
      }
      if ((aStack_90.buf[0x17] < '\0') &&
         ((void *)CONCAT71(aStack_90._1_7_,aStack_90.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(aStack_90._1_7_,aStack_90.buf[0]));
      }
      if ((local_a8.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_a8._1_7_,local_a8.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_a8._1_7_,local_a8.buf[0]));
      }
      pvVar3 = (this->_pipes).
               super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
               .
               super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_false>
               ._M_head_impl._callable.source;
      psVar2 = (this->_pipes).
               super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
               .
               super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_false>
               ._M_head_impl._callable.j1_1;
      sVar4 = *psVar2;
      *psVar2 = sVar4 + 1;
      local_d8._0_4_ =
           (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start[sVar4] + 1;
    }
LAB_00144503:
    std::variant<int,std::__cxx11::string,std::monostate>::operator=
              ((variant<int,std::__cxx11::string,std::monostate> *)
               ((this->_buffer).
                super__Vector_base<tf::CachelineAligned<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::monostate>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + pf->_line),(int *)local_d8);
    break;
  case 1:
    puVar11 = (uint *)std::get<0ul,int,std::__cxx11::string,std::monostate>
                                (&(this->_buffer).
                                  super__Vector_base<tf::CachelineAligned<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::monostate>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[pf->_line].data);
    local_5c = *puVar11;
    local_a8.buf[0] = '\0';
    local_a8.buf[0x17] = '\x17';
    aStack_90.buf[0] = '\0';
    aStack_90.buf[0x17] = '\x17';
    local_d8._0_8_ = *(undefined8 *)(doctest::detail::g_cs + 0x20);
    local_d8._8_4_ = DT_REQUIRE;
    local_c8._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_c8._8_4_ = 0x5ff;
    local_c8._16_8_ = "j1_2 < N";
    local_b0._0_1_ = true;
    local_b0._1_1_ = false;
    local_78 = false;
    local_70 = "";
    local_68 = "";
    local_48.lhs = (this->_pipes).
                   super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                   .
                   super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                   .
                   super__Head_base<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_false>
                   ._M_head_impl._callable.j1_2;
    local_48.m_at = DT_REQUIRE;
    doctest::detail::Expression_lhs<const_unsigned_long_&>::operator<<unsigned_long,_nullptr>
              (&local_f8,&local_48,
               &(this->_pipes).
                super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                .
                super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                .
                super__Head_base<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_false>
                ._M_head_impl._callable.N);
    doctest::String::operator=((String *)&aStack_90.data,&local_f8.m_decomp);
    local_b0 = CONCAT11(local_b0._1_1_,local_f8.m_passed) ^ 1;
    dVar15 = extraout_XMM0_Qa_11;
    if ((local_f8.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_f8.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_f8.m_decomp.field_0.data.ptr);
      dVar15 = extraout_XMM0_Qa_12;
    }
    doctest::detail::ResultBuilder::log((ResultBuilder *)local_d8,dVar15);
    if (extraout_AL_05 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    if ((local_b0._0_1_ == true) &&
       (bVar7 = doctest::detail::checkIfShouldThrow(local_d8._8_4_), bVar7)) {
      doctest::detail::throwException();
    }
    if ((aStack_90.buf[0x17] < '\0') &&
       ((void *)CONCAT71(aStack_90._1_7_,aStack_90.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(aStack_90._1_7_,aStack_90.buf[0]));
    }
    if ((local_a8.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_a8._1_7_,local_a8.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_a8._1_7_,local_a8.buf[0]));
    }
    local_a8.buf[0] = '\0';
    local_a8.buf[0x17] = '\x17';
    aStack_90.buf[0] = '\0';
    aStack_90.buf[0x17] = '\x17';
    local_d8._0_8_ = *(undefined8 *)(doctest::detail::g_cs + 0x20);
    local_d8._8_4_ = DT_REQUIRE;
    local_c8._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_c8._8_4_ = 0x600;
    local_c8._16_8_ = "pf.token() % L == pf.line()";
    local_b0._0_1_ = true;
    local_b0._1_1_ = false;
    local_78 = false;
    local_70 = "";
    local_68 = "";
    local_48.lhs = (unsigned_long *)
                   (pf->_token %
                   (this->_pipes).
                   super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                   .
                   super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                   .
                   super__Head_base<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_false>
                   ._M_head_impl._callable.L);
    local_48.m_at = DT_REQUIRE;
    local_58 = pf->_line;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_f8,(Expression_lhs<unsigned_long_const> *)&local_48,&local_58);
    doctest::String::operator=((String *)&aStack_90.data,&local_f8.m_decomp);
    local_b0 = CONCAT11(local_b0._1_1_,local_f8.m_passed) ^ 1;
    dVar15 = extraout_XMM0_Qa_13;
    if ((local_f8.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_f8.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_f8.m_decomp.field_0.data.ptr);
      dVar15 = extraout_XMM0_Qa_14;
    }
    doctest::detail::ResultBuilder::log((ResultBuilder *)local_d8,dVar15);
    if (extraout_AL_06 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    if ((local_b0._0_1_ == true) &&
       (bVar7 = doctest::detail::checkIfShouldThrow(local_d8._8_4_), bVar7)) {
      doctest::detail::throwException();
    }
    if ((aStack_90.buf[0x17] < '\0') &&
       ((void *)CONCAT71(aStack_90._1_7_,aStack_90.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(aStack_90._1_7_,aStack_90.buf[0]));
    }
    if ((local_a8.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_a8._1_7_,local_a8.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_a8._1_7_,local_a8.buf[0]));
    }
    local_a8.buf[0] = '\0';
    local_a8.buf[0x17] = '\x17';
    aStack_90.buf[0] = '\0';
    aStack_90.buf[0x17] = '\x17';
    local_d8._0_8_ = *(undefined8 *)(doctest::detail::g_cs + 0x20);
    local_d8._8_4_ = DT_REQUIRE;
    local_c8._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_c8._8_4_ = 0x601;
    local_c8._16_8_ = "source[j1_2] + 1 == input";
    local_b0._0_1_ = true;
    local_b0._1_1_ = false;
    local_78 = false;
    local_70 = "";
    local_68 = "";
    local_48.lhs = (unsigned_long *)
                   ((ulong)((((this->_pipes).
                              super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                              .
                              super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                              .
                              super__Head_base<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_false>
                              ._M_head_impl._callable.source)->
                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start
                            [*(this->_pipes).
                              super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                              .
                              super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                              .
                              super__Head_base<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_false>
                              ._M_head_impl._callable.j1_2] + 1) | 0xc00000000);
    doctest::detail::Expression_lhs<const_int>::operator==<int,_nullptr>
              (&local_f8,(Expression_lhs<const_int> *)&local_48,(int *)&local_5c);
    doctest::String::operator=((String *)&aStack_90.data,&local_f8.m_decomp);
    local_b0 = CONCAT11(local_b0._1_1_,local_f8.m_passed) ^ 1;
    dVar15 = extraout_XMM0_Qa_15;
    if ((local_f8.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_f8.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_f8.m_decomp.field_0.data.ptr);
      dVar15 = extraout_XMM0_Qa_16;
    }
    doctest::detail::ResultBuilder::log((ResultBuilder *)local_d8,dVar15);
    if (extraout_AL_07 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    if ((local_b0._0_1_ == true) &&
       (bVar7 = doctest::detail::checkIfShouldThrow(local_d8._8_4_), bVar7)) {
      doctest::detail::throwException();
    }
    if ((aStack_90.buf[0x17] < '\0') &&
       ((void *)CONCAT71(aStack_90._1_7_,aStack_90.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(aStack_90._1_7_,aStack_90.buf[0]));
    }
    if ((local_a8.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_a8._1_7_,local_a8.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_a8._1_7_,local_a8.buf[0]));
    }
    psVar2 = (this->_pipes).
             super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
             .
             super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
             .
             super__Head_base<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_false>
             ._M_head_impl._callable.j1_2;
    *psVar2 = *psVar2 + 1;
    __val = -local_5c;
    if (0 < (int)local_5c) {
      __val = local_5c;
    }
    __len = 1;
    if (9 < __val) {
      uVar13 = (ulong)__val;
      uVar14 = 4;
      do {
        __len = uVar14;
        uVar12 = (uint)uVar13;
        if (uVar12 < 100) {
          __len = __len - 2;
          goto LAB_00144521;
        }
        if (uVar12 < 1000) {
          __len = __len - 1;
          goto LAB_00144521;
        }
        if (uVar12 < 10000) goto LAB_00144521;
        uVar13 = uVar13 / 10000;
        uVar14 = __len + 4;
      } while (99999 < uVar12);
      __len = __len + 1;
    }
LAB_00144521:
    uVar14 = local_5c >> 0x1f;
    local_d8._0_8_ = (TestCaseData *)(local_d8 + 0x10);
    local_38 = pf;
    std::__cxx11::string::_M_construct((ulong)local_d8,(char)__len - (char)((int)local_5c >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_d8._0_8_ + (ulong)uVar14),__len,__val);
    std::variant<int,std::__cxx11::string,std::monostate>::operator=
              ((variant<int,std::__cxx11::string,std::monostate> *)
               ((this->_buffer).
                super__Vector_base<tf::CachelineAligned<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::monostate>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + local_38->_line),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
    if ((TestCaseData *)local_d8._0_8_ != (TestCaseData *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._0_8_ + 1));
    }
    break;
  case 2:
    pvVar8 = std::get<1ul,int,std::__cxx11::string,std::monostate>
                       (&(this->_buffer).
                         super__Vector_base<tf::CachelineAligned<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::monostate>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[pf->_line].data);
    local_a8.buf[0] = '\0';
    local_a8.buf[0x17] = '\x17';
    aStack_90.buf[0] = '\0';
    aStack_90.buf[0x17] = '\x17';
    local_d8._0_8_ = *(undefined8 *)(doctest::detail::g_cs + 0x20);
    local_d8._8_4_ = DT_REQUIRE;
    local_c8._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_c8._8_4_ = 0x608;
    local_c8._16_8_ = "j1_3 < N";
    local_b0._0_1_ = true;
    local_b0._1_1_ = false;
    local_78 = false;
    local_70 = "";
    local_68 = "";
    local_48.lhs = *(size_t **)
                    ((long)&(this->_pipes).
                            super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Head_base<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_false>
                            ._M_head_impl._callable + 0x10);
    local_48.m_at = DT_REQUIRE;
    doctest::detail::Expression_lhs<const_unsigned_long_&>::operator<<unsigned_long,_nullptr>
              (&local_f8,&local_48,
               &(this->_pipes).
                super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                .
                super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                .
                super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                .
                super__Head_base<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_false>
                ._M_head_impl._callable.N);
    doctest::String::operator=((String *)&aStack_90.data,&local_f8.m_decomp);
    local_b0 = CONCAT11(local_b0._1_1_,local_f8.m_passed) ^ 1;
    dVar15 = extraout_XMM0_Qa;
    if ((local_f8.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_f8.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_f8.m_decomp.field_0.data.ptr);
      dVar15 = extraout_XMM0_Qa_00;
    }
    doctest::detail::ResultBuilder::log((ResultBuilder *)local_d8,dVar15);
    if (extraout_AL != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    if ((local_b0._0_1_ == true) &&
       (bVar7 = doctest::detail::checkIfShouldThrow(local_d8._8_4_), bVar7)) goto LAB_001445d3;
    if ((aStack_90.buf[0x17] < '\0') &&
       ((void *)CONCAT71(aStack_90._1_7_,aStack_90.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(aStack_90._1_7_,aStack_90.buf[0]));
    }
    if ((local_a8.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_a8._1_7_,local_a8.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_a8._1_7_,local_a8.buf[0]));
    }
    local_a8.buf[0] = '\0';
    local_a8.buf[0x17] = '\x17';
    aStack_90.buf[0] = '\0';
    aStack_90.buf[0x17] = '\x17';
    local_d8._0_8_ = *(undefined8 *)(doctest::detail::g_cs + 0x20);
    local_d8._8_4_ = DT_REQUIRE;
    local_c8._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_c8._8_4_ = 0x609;
    local_c8._16_8_ = "pf.token() % L == pf.line()";
    local_b0._0_1_ = true;
    local_b0._1_1_ = false;
    local_78 = false;
    local_70 = "";
    local_68 = "";
    local_48.lhs = (unsigned_long *)
                   (pf->_token %
                   *(size_t *)
                    ((long)&(this->_pipes).
                            super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Head_base<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_false>
                            ._M_head_impl._callable + 0x18));
    local_48.m_at = DT_REQUIRE;
    local_58 = pf->_line;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_f8,(Expression_lhs<unsigned_long_const> *)&local_48,&local_58);
    doctest::String::operator=((String *)&aStack_90.data,&local_f8.m_decomp);
    local_b0 = CONCAT11(local_b0._1_1_,local_f8.m_passed) ^ 1;
    dVar15 = extraout_XMM0_Qa_01;
    if ((local_f8.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_f8.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_f8.m_decomp.field_0.data.ptr);
      dVar15 = extraout_XMM0_Qa_02;
    }
    doctest::detail::ResultBuilder::log((ResultBuilder *)local_d8,dVar15);
    if (extraout_AL_00 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    if ((local_b0._0_1_ == true) &&
       (bVar7 = doctest::detail::checkIfShouldThrow(local_d8._8_4_), bVar7)) {
      doctest::detail::throwException();
    }
    if ((aStack_90.buf[0x17] < '\0') &&
       ((void *)CONCAT71(aStack_90._1_7_,aStack_90.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(aStack_90._1_7_,aStack_90.buf[0]));
    }
    if ((local_a8.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_a8._1_7_,local_a8.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_a8._1_7_,local_a8.buf[0]));
    }
    local_a8.buf[0] = '\0';
    local_a8.buf[0x17] = '\x17';
    aStack_90.buf[0] = '\0';
    aStack_90.buf[0x17] = '\x17';
    local_d8._0_8_ = *(undefined8 *)(doctest::detail::g_cs + 0x20);
    local_d8._8_4_ = DT_REQUIRE;
    local_c8._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_c8._8_4_ = 0x60a;
    local_c8._16_8_ = "source[j1_3] + 1 == stoi(input)";
    local_b0 = 1;
    local_78 = false;
    local_70 = "";
    local_68 = "";
    local_58 = (ulong)(((*(vector<int,_std::allocator<int>_> **)
                          ((long)&(this->_pipes).
                                  super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                  .
                                  super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                  .
                                  super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                  .
                                  super__Head_base<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_false>
                                  ._M_head_impl._callable + 8))->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start
                       [**(size_t **)
                          ((long)&(this->_pipes).
                                  super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                  .
                                  super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                  .
                                  super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                  .
                                  super__Head_base<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_false>
                                  ._M_head_impl._callable + 0x10)] + 1) | 0xc00000000;
    psVar2 = (size_t *)(pvVar8->_M_dataplus)._M_p;
    local_38 = (Pipeflow *)pvVar8;
    piVar9 = __errno_location();
    local_4c = *piVar9;
    *piVar9 = 0;
    lVar10 = strtol((char *)psVar2,(char **)&local_48,10);
    if (local_48.lhs == psVar2) {
      std::__throw_invalid_argument("stoi");
LAB_001445ac:
      std::__throw_out_of_range("stoi");
LAB_001445bb:
      std::__throw_invalid_argument("stoi");
    }
    else {
      if ((lVar10 - 0x80000000U < 0xffffffff00000000) || (*piVar9 == 0x22)) goto LAB_001445ac;
      if (*piVar9 == 0) {
        *piVar9 = local_4c;
      }
      local_5c = (uint)lVar10;
      doctest::detail::Expression_lhs<int_const>::operator==
                (&local_f8,(Expression_lhs<int_const> *)&local_58,(int *)&local_5c);
      pPVar6 = local_38;
      doctest::String::operator=((String *)&aStack_90.data,&local_f8.m_decomp);
      local_b0 = CONCAT11(local_b0._1_1_,local_f8.m_passed) ^ 1;
      dVar15 = extraout_XMM0_Qa_03;
      if ((local_f8.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_f8.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_f8.m_decomp.field_0.data.ptr);
        dVar15 = extraout_XMM0_Qa_04;
      }
      doctest::detail::ResultBuilder::log((ResultBuilder *)local_d8,dVar15);
      if (extraout_AL_01 != '\0') {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
      if ((local_b0._0_1_ == true) &&
         (bVar7 = doctest::detail::checkIfShouldThrow(local_d8._8_4_), bVar7)) {
        doctest::detail::throwException();
      }
      if ((aStack_90.buf[0x17] < '\0') &&
         ((void *)CONCAT71(aStack_90._1_7_,aStack_90.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(aStack_90._1_7_,aStack_90.buf[0]));
      }
      if ((local_a8.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_a8._1_7_,local_a8.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_a8._1_7_,local_a8.buf[0]));
      }
      psVar2 = *(size_t **)
                ((long)&(this->_pipes).
                        super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                        .
                        super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                        .
                        super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                        .
                        super__Head_base<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_false>
                        ._M_head_impl._callable + 0x10);
      *psVar2 = *psVar2 + 1;
      __nptr = (TestCaseData *)((_Alloc_hider *)&pPVar6->_line)->_M_p;
      iVar1 = *piVar9;
      *piVar9 = 0;
      lVar10 = strtol((char *)__nptr,(char **)local_d8,10);
      if ((TestCaseData *)local_d8._0_8_ == __nptr) goto LAB_001445bb;
      if ((0xfffffffeffffffff < lVar10 - 0x80000000U) && (*piVar9 != 0x22)) {
        if (*piVar9 == 0) {
          *piVar9 = iVar1;
        }
        local_d8._0_4_ = (int)lVar10;
        goto LAB_00144503;
      }
    }
    std::__throw_out_of_range("stoi");
LAB_001445d3:
    doctest::detail::throwException();
  case 3:
    puVar11 = (uint *)std::get<0ul,int,std::__cxx11::string,std::monostate>
                                (&(this->_buffer).
                                  super__Vector_base<tf::CachelineAligned<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::monostate>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[pf->_line].data);
    local_5c = *puVar11;
    local_a8.buf[0] = '\0';
    local_a8.buf[0x17] = '\x17';
    aStack_90.buf[0] = '\0';
    aStack_90.buf[0x17] = '\x17';
    local_d8._0_8_ = *(undefined8 *)(doctest::detail::g_cs + 0x20);
    local_d8._8_4_ = DT_REQUIRE;
    local_c8._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_c8._8_4_ = 0x611;
    local_c8._16_8_ = "j1_4 < N";
    local_b0._0_1_ = true;
    local_b0._1_1_ = false;
    local_78 = false;
    local_70 = "";
    local_68 = "";
    local_48.lhs = *(size_t **)
                    ((long)&(this->_pipes).
                            super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Tuple_impl<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Head_base<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>,_false>
                            ._M_head_impl + 0x18);
    local_48.m_at = DT_REQUIRE;
    doctest::detail::Expression_lhs<const_unsigned_long_&>::operator<<unsigned_long,_nullptr>
              (&local_f8,&local_48,
               (unsigned_long *)
               ((long)&(this->_pipes).
                       super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                       .
                       super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                       .
                       super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                       .
                       super__Tuple_impl<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                       .
                       super__Head_base<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>,_false>
                       ._M_head_impl + 8));
    doctest::String::operator=((String *)&aStack_90.data,&local_f8.m_decomp);
    local_b0 = CONCAT11(local_b0._1_1_,local_f8.m_passed) ^ 1;
    dVar15 = extraout_XMM0_Qa_05;
    if ((local_f8.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_f8.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_f8.m_decomp.field_0.data.ptr);
      dVar15 = extraout_XMM0_Qa_06;
    }
    doctest::detail::ResultBuilder::log((ResultBuilder *)local_d8,dVar15);
    if (extraout_AL_02 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    if ((local_b0._0_1_ == true) &&
       (bVar7 = doctest::detail::checkIfShouldThrow(local_d8._8_4_), bVar7)) {
      doctest::detail::throwException();
    }
    if ((aStack_90.buf[0x17] < '\0') &&
       ((void *)CONCAT71(aStack_90._1_7_,aStack_90.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(aStack_90._1_7_,aStack_90.buf[0]));
    }
    if ((local_a8.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_a8._1_7_,local_a8.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_a8._1_7_,local_a8.buf[0]));
    }
    local_a8.buf[0] = '\0';
    local_a8.buf[0x17] = '\x17';
    aStack_90.buf[0] = '\0';
    aStack_90.buf[0x17] = '\x17';
    local_d8._0_8_ = *(undefined8 *)(doctest::detail::g_cs + 0x20);
    local_d8._8_4_ = DT_REQUIRE;
    local_c8._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_c8._8_4_ = 0x612;
    local_c8._16_8_ = "pf.token() % L == pf.line()";
    local_b0._0_1_ = true;
    local_b0._1_1_ = false;
    local_78 = false;
    local_70 = "";
    local_68 = "";
    local_48.lhs = (unsigned_long *)
                   (pf->_token %
                   *(size_t *)
                    ((long)&(this->_pipes).
                            super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Tuple_impl<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Head_base<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>,_false>
                            ._M_head_impl + 0x20));
    local_48.m_at = DT_REQUIRE;
    local_58 = pf->_line;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_f8,(Expression_lhs<unsigned_long_const> *)&local_48,&local_58);
    doctest::String::operator=((String *)&aStack_90.data,&local_f8.m_decomp);
    local_b0 = CONCAT11(local_b0._1_1_,local_f8.m_passed) ^ 1;
    dVar15 = extraout_XMM0_Qa_07;
    if ((local_f8.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_f8.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_f8.m_decomp.field_0.data.ptr);
      dVar15 = extraout_XMM0_Qa_08;
    }
    doctest::detail::ResultBuilder::log((ResultBuilder *)local_d8,dVar15);
    if (extraout_AL_03 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    if ((local_b0._0_1_ == true) &&
       (bVar7 = doctest::detail::checkIfShouldThrow(local_d8._8_4_), bVar7)) {
      doctest::detail::throwException();
    }
    if ((aStack_90.buf[0x17] < '\0') &&
       ((void *)CONCAT71(aStack_90._1_7_,aStack_90.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(aStack_90._1_7_,aStack_90.buf[0]));
    }
    if ((local_a8.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_a8._1_7_,local_a8.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_a8._1_7_,local_a8.buf[0]));
    }
    local_a8.buf[0] = '\0';
    local_a8.buf[0x17] = '\x17';
    aStack_90.buf[0] = '\0';
    aStack_90.buf[0x17] = '\x17';
    local_d8._0_8_ = *(undefined8 *)(doctest::detail::g_cs + 0x20);
    local_d8._8_4_ = DT_REQUIRE;
    local_c8._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_c8._8_4_ = 0x613;
    local_c8._16_8_ = "source[j1_4] + 1 == input";
    local_b0._0_1_ = true;
    local_b0._1_1_ = false;
    local_78 = false;
    local_70 = "";
    local_68 = "";
    local_48.lhs = (unsigned_long *)
                   ((ulong)(((*(vector<int,_std::allocator<int>_> **)
                               ((long)&(this->_pipes).
                                       super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                       .
                                       super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                       .
                                       super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                       .
                                       super__Tuple_impl<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                       .
                                       super__Head_base<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>,_false>
                                       ._M_head_impl + 0x10))->
                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start
                            [**(size_t **)
                               ((long)&(this->_pipes).
                                       super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                       .
                                       super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                       .
                                       super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                       .
                                       super__Tuple_impl<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                       .
                                       super__Head_base<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>,_false>
                                       ._M_head_impl + 0x18)] + 1) | 0xc00000000);
    doctest::detail::Expression_lhs<const_int>::operator==<int,_nullptr>
              (&local_f8,(Expression_lhs<const_int> *)&local_48,(int *)&local_5c);
    doctest::String::operator=((String *)&aStack_90.data,&local_f8.m_decomp);
    local_b0 = CONCAT11(local_b0._1_1_,local_f8.m_passed) ^ 1;
    dVar15 = extraout_XMM0_Qa_09;
    if ((local_f8.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_f8.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_f8.m_decomp.field_0.data.ptr);
      dVar15 = extraout_XMM0_Qa_10;
    }
    doctest::detail::ResultBuilder::log((ResultBuilder *)local_d8,dVar15);
    if (extraout_AL_04 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    if ((local_b0._0_1_ == true) &&
       (bVar7 = doctest::detail::checkIfShouldThrow(local_d8._8_4_), bVar7)) {
      doctest::detail::throwException();
    }
    if ((aStack_90.buf[0x17] < '\0') &&
       ((void *)CONCAT71(aStack_90._1_7_,aStack_90.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(aStack_90._1_7_,aStack_90.buf[0]));
    }
    if ((local_a8.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_a8._1_7_,local_a8.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_a8._1_7_,local_a8.buf[0]));
    }
    psVar2 = *(size_t **)
              ((long)&(this->_pipes).
                      super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                      .
                      super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                      .
                      super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                      .
                      super__Tuple_impl<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                      .
                      super__Head_base<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>,_false>
                      ._M_head_impl + 0x18);
    *psVar2 = *psVar2 + 1;
  }
  return;
}

Assistant:

void DataPipeline<Ps...>::_on_pipe(Pipeflow& pf, Runtime&) {

  visit_tuple([&](auto&& pipe){

    using data_pipe_t = std::decay_t<decltype(pipe)>;
    using callable_t  = typename data_pipe_t::callable_t;
    using input_t     = std::decay_t<typename data_pipe_t::input_t>;
    using output_t    = std::decay_t<typename data_pipe_t::output_t>;
    
    // first pipe
    if constexpr (std::is_invocable_v<callable_t, Pipeflow&>) {
      // [](tf::Pipeflow&) -> void {}, i.e., we only have one pipe
      if constexpr (std::is_void_v<output_t>) {
        pipe._callable(pf);
      // [](tf::Pipeflow&) -> output_t {}
      } else {
        _buffer[pf._line].data = pipe._callable(pf);
      }
    }
    // other pipes without pipeflow in the second argument
    else if constexpr (std::is_invocable_v<callable_t, std::add_lvalue_reference_t<input_t> >) {
      // [](input_t&) -> void {}, i.e., the last pipe
      if constexpr (std::is_void_v<output_t>) {
        pipe._callable(std::get<input_t>(_buffer[pf._line].data));
      // [](input_t&) -> output_t {}
      } else {
        _buffer[pf._line].data = pipe._callable(
          std::get<input_t>(_buffer[pf._line].data)
        );
      }
    }
    // other pipes with pipeflow in the second argument
    else if constexpr (std::is_invocable_v<callable_t, input_t&, Pipeflow&>) {
      // [](input_t&, tf::Pipeflow&) -> void {}
      if constexpr (std::is_void_v<output_t>) {
        pipe._callable(std::get<input_t>(_buffer[pf._line].data), pf);
      // [](input_t&, tf::Pipeflow&) -> output_t {}
      } else {
        _buffer[pf._line].data = pipe._callable(
          std::get<input_t>(_buffer[pf._line].data), pf
        );
      }
    }
    //else if constexpr(std::is_invocable_v<callable_t, Pipeflow&, Runtime&>) {
    //  pipe._callable(pf, rt);
    //}
    else {
      static_assert(dependent_false_v<callable_t>, "un-supported pipe callable type");
    }
  }, _pipes, pf._pipe);
}